

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimulationIslandManager.cpp
# Opt level: O0

void __thiscall
btSimulationIslandManager::updateActivationState
          (btSimulationIslandManager *this,btCollisionWorld *colWorld,btDispatcher *dispatcher)

{
  btCollisionObject *this_00;
  bool bVar1;
  int iVar2;
  btCollisionObjectArray *pbVar3;
  btCollisionObject **ppbVar4;
  btCollisionWorld *in_RSI;
  btSimulationIslandManager *in_RDI;
  btCollisionObject *collisionObject;
  int i;
  int index;
  int n;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_1c = 0;
  local_20 = 0;
  while( true ) {
    n = local_20;
    pbVar3 = btCollisionWorld::getCollisionObjectArray(in_RSI);
    iVar2 = btAlignedObjectArray<btCollisionObject_*>::size(pbVar3);
    if (iVar2 <= n) break;
    pbVar3 = btCollisionWorld::getCollisionObjectArray(in_RSI);
    ppbVar4 = btAlignedObjectArray<btCollisionObject_*>::operator[](pbVar3,local_20);
    this_00 = *ppbVar4;
    bVar1 = btCollisionObject::isStaticOrKinematicObject(this_00);
    if (!bVar1) {
      btCollisionObject::setIslandTag(this_00,local_1c);
      local_1c = local_1c + 1;
    }
    btCollisionObject::setCompanionId(this_00,-1);
    btCollisionObject::setHitFraction(this_00,1.0);
    local_20 = local_20 + 1;
  }
  initUnionFind(in_RDI,n);
  findUnions((btSimulationIslandManager *)dispatcher,_i,(btCollisionWorld *)collisionObject);
  return;
}

Assistant:

void   btSimulationIslandManager::updateActivationState(btCollisionWorld* colWorld,btDispatcher* dispatcher)
{

	// put the index into m_controllers into m_tag   
	int index = 0;
	{

		int i;
		for (i=0;i<colWorld->getCollisionObjectArray().size(); i++)
		{
			btCollisionObject*   collisionObject= colWorld->getCollisionObjectArray()[i];
			//Adding filtering here
			if (!collisionObject->isStaticOrKinematicObject())
			{
				collisionObject->setIslandTag(index++);
			}
			collisionObject->setCompanionId(-1);
			collisionObject->setHitFraction(btScalar(1.));
		}
	}
	// do the union find

	initUnionFind( index );

	findUnions(dispatcher,colWorld);
}